

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.c
# Opt level: O0

void vrna_md_defaults_reset(vrna_md_t *md_p)

{
  vrna_md_t *md_p_local;
  
  defaults.dangles = 2;
  defaults.special_hp = 1;
  defaults.noLP = 0;
  defaults.noGU = 0;
  defaults.noGUclosure = 0;
  defaults.logML = 0;
  defaults.gquad = 0;
  defaults.circ = 0;
  defaults.uniq_ML = 0;
  defaults.compute_bpp = 1;
  defaults.backtrack = 1;
  defaults.backtrack_type = 'F';
  defaults.energy_set = 0;
  defaults.max_bp_span = -1;
  defaults.min_loop_size = 3;
  defaults.window_size = -1;
  defaults.oldAliEn = 0;
  defaults.ribo = 0;
  defaults.cv_fact = 1.0;
  defaults.nc_fact = 1.0;
  defaults.temperature = 37.0;
  defaults.betaScale = 1.0;
  defaults.pf_smooth = 1;
  defaults.sfact = 1.07;
  defaults.nonstandards[0] = '\0';
  if (md_p != (vrna_md_t *)0x0) {
    vrna_md_defaults_dangles(md_p->dangles);
    vrna_md_defaults_special_hp(md_p->special_hp);
    vrna_md_defaults_noLP(md_p->noLP);
    vrna_md_defaults_noGU(md_p->noGU);
    vrna_md_defaults_noGUclosure(md_p->noGUclosure);
    vrna_md_defaults_logML(md_p->logML);
    vrna_md_defaults_gquad(md_p->gquad);
    vrna_md_defaults_circ(md_p->circ);
    vrna_md_defaults_uniq_ML(md_p->uniq_ML);
    vrna_md_defaults_compute_bpp(md_p->compute_bpp);
    vrna_md_defaults_backtrack(md_p->backtrack);
    vrna_md_defaults_backtrack_type(md_p->backtrack_type);
    vrna_md_defaults_energy_set(md_p->energy_set);
    vrna_md_defaults_max_bp_span(md_p->max_bp_span);
    vrna_md_defaults_min_loop_size(md_p->min_loop_size);
    vrna_md_defaults_window_size(md_p->window_size);
    vrna_md_defaults_oldAliEn(md_p->oldAliEn);
    vrna_md_defaults_ribo(md_p->ribo);
    vrna_md_defaults_cv_fact(md_p->cv_fact);
    vrna_md_defaults_nc_fact(md_p->nc_fact);
    vrna_md_defaults_temperature(md_p->temperature);
    vrna_md_defaults_betaScale(md_p->betaScale);
    vrna_md_defaults_pf_smooth(md_p->pf_smooth);
    vrna_md_defaults_sfact(md_p->sfact);
    copy_nonstandards(&defaults,md_p->nonstandards);
  }
  vrna_md_update(&defaults);
  temperature = defaults.temperature;
  pf_scale = -1.0;
  dangles = defaults.dangles;
  tetra_loop = defaults.special_hp;
  noLonelyPairs = defaults.noLP;
  noGU = defaults.noGU;
  no_closingGU = defaults.noGUclosure;
  circ = defaults.circ;
  gquad = defaults.gquad;
  uniq_ML = defaults.uniq_ML;
  energy_set = defaults.energy_set;
  do_backtrack = defaults.compute_bpp;
  backtrack_type = defaults.backtrack_type;
  nonstandards = defaults.nonstandards;
  max_bp_span = defaults.max_bp_span;
  oldAliEn = defaults.oldAliEn;
  ribo = defaults.ribo;
  cv_fact = defaults.cv_fact;
  nc_fact = defaults.nc_fact;
  logML = defaults.logML;
  return;
}

Assistant:

PUBLIC void
vrna_md_defaults_reset(vrna_md_t *md_p)
{
  /* first, reset to factory defaults */
  defaults.dangles          = VRNA_MODEL_DEFAULT_DANGLES;
  defaults.special_hp       = VRNA_MODEL_DEFAULT_SPECIAL_HP;
  defaults.noLP             = VRNA_MODEL_DEFAULT_NO_LP;
  defaults.noGU             = VRNA_MODEL_DEFAULT_NO_GU;
  defaults.noGUclosure      = VRNA_MODEL_DEFAULT_NO_GU_CLOSURE;
  defaults.logML            = VRNA_MODEL_DEFAULT_LOG_ML;
  defaults.gquad            = VRNA_MODEL_DEFAULT_GQUAD;
  defaults.circ             = VRNA_MODEL_DEFAULT_CIRC;
  defaults.uniq_ML          = VRNA_MODEL_DEFAULT_UNIQ_ML;
  defaults.compute_bpp      = VRNA_MODEL_DEFAULT_COMPUTE_BPP;
  defaults.backtrack        = VRNA_MODEL_DEFAULT_BACKTRACK;
  defaults.backtrack_type   = VRNA_MODEL_DEFAULT_BACKTRACK_TYPE;
  defaults.energy_set       = VRNA_MODEL_DEFAULT_ENERGY_SET;
  defaults.max_bp_span      = VRNA_MODEL_DEFAULT_MAX_BP_SPAN;
  defaults.min_loop_size    = TURN;
  defaults.window_size      = VRNA_MODEL_DEFAULT_WINDOW_SIZE;
  defaults.oldAliEn         = VRNA_MODEL_DEFAULT_ALI_OLD_EN;
  defaults.ribo             = VRNA_MODEL_DEFAULT_ALI_RIBO;
  defaults.cv_fact          = VRNA_MODEL_DEFAULT_ALI_CV_FACT;
  defaults.nc_fact          = VRNA_MODEL_DEFAULT_ALI_NC_FACT;
  defaults.temperature      = VRNA_MODEL_DEFAULT_TEMPERATURE;
  defaults.betaScale        = VRNA_MODEL_DEFAULT_BETA_SCALE;
  defaults.pf_smooth        = VRNA_MODEL_DEFAULT_PF_SMOOTH;
  defaults.sfact            = 1.07;
  defaults.nonstandards[0]  = '\0';

  if (md_p) {
    /* now try to apply user settings */
    /*
     *  Note that we use wrapper functions here instead of
     *  faster direct memory copy because we want to ensure
     *  that model settings always comply to the constraints
     *  we set in the wrappers
     */
    vrna_md_defaults_dangles(md_p->dangles);
    vrna_md_defaults_special_hp(md_p->special_hp);
    vrna_md_defaults_noLP(md_p->noLP);
    vrna_md_defaults_noGU(md_p->noGU);
    vrna_md_defaults_noGUclosure(md_p->noGUclosure);
    vrna_md_defaults_logML(md_p->logML);
    vrna_md_defaults_gquad(md_p->gquad);
    vrna_md_defaults_circ(md_p->circ);
    vrna_md_defaults_uniq_ML(md_p->uniq_ML);
    vrna_md_defaults_compute_bpp(md_p->compute_bpp);
    vrna_md_defaults_backtrack(md_p->backtrack);
    vrna_md_defaults_backtrack_type(md_p->backtrack_type);
    vrna_md_defaults_energy_set(md_p->energy_set);
    vrna_md_defaults_max_bp_span(md_p->max_bp_span);
    vrna_md_defaults_min_loop_size(md_p->min_loop_size);
    vrna_md_defaults_window_size(md_p->window_size);
    vrna_md_defaults_oldAliEn(md_p->oldAliEn);
    vrna_md_defaults_ribo(md_p->ribo);
    vrna_md_defaults_cv_fact(md_p->cv_fact);
    vrna_md_defaults_nc_fact(md_p->nc_fact);
    vrna_md_defaults_temperature(md_p->temperature);
    vrna_md_defaults_betaScale(md_p->betaScale);
    vrna_md_defaults_pf_smooth(md_p->pf_smooth);
    vrna_md_defaults_sfact(md_p->sfact);
    copy_nonstandards(&defaults, &(md_p->nonstandards[0]));
  }

  /* update pair/rtype/alias arrays accordingly */
  vrna_md_update(&defaults);

#ifndef VRNA_DISABLE_BACKWARD_COMPATIBILITY
  temperature     = defaults.temperature;
  pf_scale        = VRNA_MODEL_DEFAULT_PF_SCALE;
  dangles         = defaults.dangles;
  tetra_loop      = defaults.special_hp;
  noLonelyPairs   = defaults.noLP;
  noGU            = defaults.noGU;
  no_closingGU    = defaults.noGUclosure;
  circ            = defaults.circ;
  gquad           = defaults.gquad;
  uniq_ML         = defaults.uniq_ML;
  energy_set      = defaults.energy_set;
  do_backtrack    = defaults.compute_bpp;
  backtrack_type  = defaults.backtrack_type;
  nonstandards    = defaults.nonstandards;
  max_bp_span     = defaults.max_bp_span;
  oldAliEn        = defaults.oldAliEn;
  ribo            = defaults.ribo;
  cv_fact         = defaults.cv_fact;
  nc_fact         = defaults.nc_fact;
  logML           = defaults.logML;
#endif
}